

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevolute.h
# Opt level: O2

ChCoordsys<double> * __thiscall
chrono::ChLinkRevolute::GetLinkRelativeCoords
          (ChCoordsys<double> *__return_storage_ptr__,ChLinkRevolute *this)

{
  ChCoordsys<double>::ChCoordsys(__return_storage_ptr__,&(this->m_frame2).coord);
  return __return_storage_ptr__;
}

Assistant:

virtual ChCoordsys<> GetLinkRelativeCoords() override { return m_frame2.GetCoord(); }